

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O2

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::AddAlreadyReserved
          (RepeatedField<unsigned_long> *this,unsigned_long *value)

{
  int iVar1;
  unsigned_long uVar2;
  
  uVar2 = *value;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + 1;
  *(unsigned_long *)((long)this->arena_or_elements_ + (long)iVar1 * 8) = uVar2;
  return;
}

Assistant:

inline void RepeatedField<Element>::AddAlreadyReserved(const Element& value) {
  GOOGLE_DCHECK_LT(current_size_, total_size_);
  elements()[current_size_++] = value;
}